

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

ulong __thiscall CVmObjString::rebuild_image(CVmObjString *this,char *buf,ulong buflen)

{
  ushort *__src;
  ulong __n;
  
  __src = (ushort *)(this->super_CVmObject).ext_;
  __n = (ulong)*__src + 2;
  if (__n <= buflen) {
    memcpy(buf,__src,__n);
  }
  return __n;
}

Assistant:

ulong CVmObjString::rebuild_image(VMG_ char *buf, ulong buflen)
{
    size_t copy_size;

    /* calculate how much space we need to store the data */
    copy_size = vmb_get_len(ext_) + VMB_LEN;

    /* make sure we have room for our data */
    if (copy_size > buflen)
        return copy_size;

    /* copy the data */
    memcpy(buf, ext_, copy_size);

    /* return the size */
    return copy_size;
}